

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
JsUtil::List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer>::New
          (Recycler *alloc,int increment)

{
  Recycler *alloc_00;
  List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *pLVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  local_40 = (undefined1  [8])
             &List<void*,Memory::Recycler,false,Js::CopyRemovePolicy,DefaultComparer>::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_26e34b;
  data.filename._0_4_ = 0x12e;
  alloc_00 = Memory::Recycler::TrackAllocInfo(alloc,(TrackAllocData *)local_40);
  pLVar1 = (List<void_*,_Memory::Recycler,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
           new<Memory::Recycler>(0x30,alloc_00,0x37ff80);
  (pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).alloc = alloc;
  (pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>)._vptr_ReadOnlyList =
       (_func_int **)&PTR_IsReadOnly_013878c8;
  pLVar1->increment = increment;
  (pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).buffer.ptr =
       (WriteBarrierPtr<void> *)0x0;
  (pLVar1->super_ReadOnlyList<void_*,_Memory::Recycler,_DefaultComparer>).count = 0;
  pLVar1->length = 0;
  return pLVar1;
}

Assistant:

static List * New(TAllocator * alloc, int increment = DefaultIncrement)
        {
            return AllocatorNew(TAllocator, alloc, List, alloc, increment);
        }